

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pad.cpp
# Opt level: O1

void duckdb::PadFunction<duckdb::RightPadOperator>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  ulong *puVar1;
  idx_t count;
  unsigned_long *puVar2;
  long lVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  anon_union_16_2_67f50693_for_value *paVar4;
  byte bVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  reference this_00;
  reference this_01;
  reference this_02;
  idx_t iVar9;
  ulong uVar10;
  TemplatedValidityData<unsigned_long> *pTVar11;
  idx_t iVar12;
  ulong uVar13;
  vector<char,_true> *pvVar14;
  idx_t iVar15;
  ulong uVar16;
  data_ptr_t pdVar17;
  int32_t iVar18;
  idx_t idx_in_entry;
  idx_t iVar19;
  ulong uVar20;
  string_t sVar21;
  anon_struct_16_3_d7536bce_for_pointer aVar22;
  string_t data;
  string_t data_00;
  string_t data_01;
  vector<char,_true> buffer;
  UnifiedVectorFormat bdata;
  UnifiedVectorFormat adata;
  anon_union_16_2_67f50693_for_value local_168;
  data_ptr_t local_158;
  char *local_150;
  char *local_148;
  long *local_140;
  anon_union_16_2_67f50693_for_value local_138;
  vector<char,_true> local_128;
  buffer_ptr<ValidityBuffer> *local_110;
  anon_union_16_2_67f50693_for_value local_108;
  long local_f8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c8;
  anon_union_16_2_67f50693_for_value local_c0;
  long local_b0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  UnifiedVectorFormat local_78;
  
  this_00 = vector<duckdb::Vector,_true>::operator[](&args->data,0);
  this_01 = vector<duckdb::Vector,_true>::operator[](&args->data,1);
  this_02 = vector<duckdb::Vector,_true>::operator[](&args->data,2);
  local_128.super_vector<char,_std::allocator<char>_>.
  super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_128.super_vector<char,_std::allocator<char>_>.
  super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_128.super_vector<char,_std::allocator<char>_>.
  super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)0x0;
  count = args->count;
  if (((this_00->vector_type == CONSTANT_VECTOR) && (this_01->vector_type == CONSTANT_VECTOR)) &&
     (this_02->vector_type == CONSTANT_VECTOR)) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    puVar2 = (this_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((((puVar2 == (unsigned_long *)0x0) || ((*puVar2 & 1) != 0)) &&
        ((puVar2 = (this_01->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask,
         puVar2 == (unsigned_long *)0x0 || ((*puVar2 & 1) != 0)))) &&
       ((puVar2 = (this_02->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask,
        puVar2 == (unsigned_long *)0x0 || ((*puVar2 & 1) != 0)))) {
      paVar4 = (anon_union_16_2_67f50693_for_value *)result->data;
      local_c0._0_8_ = *(undefined8 *)this_00->data;
      local_c0.pointer.ptr = (char *)*(undefined8 *)(this_00->data + 8);
      local_108._0_8_ = *(undefined8 *)this_02->data;
      local_108.pointer.ptr = (char *)*(undefined8 *)(this_02->data + 8);
      iVar18 = 0;
      if (0 < *(int *)this_01->data) {
        iVar18 = *(int *)this_01->data;
      }
      pvVar14 = &local_128;
      sVar21 = RightPadOperator::Operation
                         ((string_t *)&local_c0.pointer,iVar18,(string_t *)&local_108.pointer,
                          pvVar14);
      data_01.value._0_8_ = sVar21.value._8_8_;
      data_01.value.pointer.ptr = (char *)pvVar14;
      aVar22 = (anon_struct_16_3_d7536bce_for_pointer)
               StringVector::AddString((StringVector *)result,sVar21.value._0_8_,data_01);
      paVar4->pointer = aVar22;
    }
    else {
      ConstantVector::SetNull(result,true);
    }
  }
  else {
    Vector::SetVectorType(result,FLAT_VECTOR);
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_c0.pointer);
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_108.pointer);
    UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
    Vector::ToUnifiedFormat(this_00,count,(UnifiedVectorFormat *)&local_c0.pointer);
    Vector::ToUnifiedFormat(this_01,count,(UnifiedVectorFormat *)&local_108.pointer);
    Vector::ToUnifiedFormat(this_02,count,&local_78);
    uVar8 = local_108._0_8_;
    local_140 = (long *)local_c0._0_8_;
    local_148 = local_c0.pointer.ptr;
    local_150 = local_108.pointer.ptr;
    local_158 = local_78.data;
    pdVar17 = result->data;
    FlatVector::VerifyFlatVector(result);
    if (((local_b0 == 0) && (local_f8 == 0)) &&
       (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0)) {
      if (count != 0) {
        pdVar17 = pdVar17 + 8;
        iVar19 = 0;
        do {
          iVar9 = iVar19;
          if (*local_140 != 0) {
            iVar9 = (idx_t)*(uint *)(*local_140 + iVar19 * 4);
          }
          lVar3 = *(long *)uVar8;
          iVar12 = iVar19;
          if (lVar3 != 0) {
            iVar12 = (idx_t)*(uint *)(lVar3 + iVar19 * 4);
          }
          iVar15 = iVar19;
          if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
            iVar15 = (idx_t)(local_78.sel)->sel_vector[iVar19];
          }
          local_168._0_8_ = *(undefined8 *)(local_148 + iVar9 * 0x10);
          local_168.pointer.ptr = (char *)*(undefined8 *)(local_148 + iVar9 * 0x10 + 8);
          local_138._0_8_ = *(undefined8 *)(local_158 + iVar15 * 0x10);
          local_138.pointer.ptr = (char *)*(idx_t *)((long)(local_158 + iVar15 * 0x10) + 8);
          iVar18 = *(int *)(local_150 + iVar12 * 4);
          if (*(int *)(local_150 + iVar12 * 4) < 1) {
            iVar18 = 0;
          }
          pvVar14 = &local_128;
          sVar21 = RightPadOperator::Operation
                             ((string_t *)&local_168.pointer,iVar18,(string_t *)&local_138.pointer,
                              pvVar14);
          data.value._0_8_ = sVar21.value._8_8_;
          data.value.pointer.ptr = (char *)pvVar14;
          sVar21 = StringVector::AddString((StringVector *)result,sVar21.value._0_8_,data);
          *(long *)(pdVar17 + -8) = sVar21.value._0_8_;
          *(long *)pdVar17 = sVar21.value._8_8_;
          iVar19 = iVar19 + 1;
          pdVar17 = pdVar17 + 0x10;
        } while (count != iVar19);
      }
    }
    else if (count != 0) {
      local_110 = &(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
      pdVar17 = pdVar17 + 8;
      uVar20 = 0;
      do {
        uVar10 = uVar20;
        if (*local_140 != 0) {
          uVar10 = (ulong)*(uint *)(*local_140 + uVar20 * 4);
        }
        lVar3 = *(long *)uVar8;
        uVar13 = uVar20;
        if (lVar3 != 0) {
          uVar13 = (ulong)*(uint *)(lVar3 + uVar20 * 4);
        }
        uVar16 = uVar20;
        if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
          uVar16 = (ulong)(local_78.sel)->sel_vector[uVar20];
        }
        if (((local_b0 == 0) ||
            ((*(ulong *)(local_b0 + (uVar10 >> 6) * 8) >> (uVar10 & 0x3f) & 1) != 0)) &&
           (((local_f8 == 0 ||
             ((*(ulong *)(local_f8 + (uVar13 >> 6) * 8) >> (uVar13 & 0x3f) & 1) != 0)) &&
            ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0 ||
             ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
               [uVar16 >> 6] >> (uVar16 & 0x3f) & 1) != 0)))))) {
          local_168._0_8_ = *(undefined8 *)(local_148 + uVar10 * 0x10);
          local_168.pointer.ptr = (char *)*(undefined8 *)(local_148 + uVar10 * 0x10 + 8);
          local_138._0_8_ = *(undefined8 *)(local_158 + uVar16 * 0x10);
          local_138.pointer.ptr = (char *)*(idx_t *)((long)(local_158 + uVar16 * 0x10) + 8);
          iVar18 = *(int *)(local_150 + uVar13 * 4);
          if (*(int *)(local_150 + uVar13 * 4) < 1) {
            iVar18 = 0;
          }
          pvVar14 = &local_128;
          sVar21 = RightPadOperator::Operation
                             ((string_t *)&local_168.pointer,iVar18,(string_t *)&local_138.pointer,
                              pvVar14);
          data_00.value._0_8_ = sVar21.value._8_8_;
          data_00.value.pointer.ptr = (char *)pvVar14;
          sVar21 = StringVector::AddString((StringVector *)result,sVar21.value._0_8_,data_00);
          *(long *)(pdVar17 + -8) = sVar21.value._0_8_;
          *(long *)pdVar17 = sVar21.value._8_8_;
        }
        else {
          if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            local_138._0_8_ = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity
            ;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)&local_168.pointer,(unsigned_long *)&local_138);
            uVar7 = local_168.pointer.ptr;
            uVar6 = local_168._0_8_;
            local_168._0_8_ = (element_type *)0x0;
            local_168.pointer.ptr = (char *)0x0;
            this = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (element_type *)uVar6;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7;
            if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168.pointer.ptr !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168.pointer.ptr);
            }
            pTVar11 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                (local_110);
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                 (unsigned_long *)
                 (pTVar11->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>;
          }
          bVar5 = (byte)uVar20 & 0x3f;
          puVar1 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
                   (uVar20 >> 6);
          *puVar1 = *puVar1 & (-2L << bVar5 | 0xfffffffffffffffeU >> 0x40 - bVar5);
        }
        uVar20 = uVar20 + 1;
        pdVar17 = pdVar17 + 0x10;
      } while (count != uVar20);
    }
    if (local_78.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if (local_c8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c8);
    }
    if (local_e8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e8);
    }
    if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80);
    }
    if (local_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0);
    }
  }
  if (local_128.super_vector<char,_std::allocator<char>_>.
      super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start !=
      (pointer)0x0) {
    operator_delete(local_128.super_vector<char,_std::allocator<char>_>.
                    super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                    _M_start);
  }
  return;
}

Assistant:

static void PadFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	auto &str_vector = args.data[0];
	auto &len_vector = args.data[1];
	auto &pad_vector = args.data[2];

	vector<char> buffer;
	TernaryExecutor::Execute<string_t, int32_t, string_t, string_t>(
	    str_vector, len_vector, pad_vector, result, args.size(), [&](string_t str, int32_t len, string_t pad) {
		    len = MaxValue<int32_t>(len, 0);
		    return StringVector::AddString(result, OP::Operation(str, len, pad, buffer));
	    });
}